

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         write_significand<char,fmt::v10::appender,unsigned_long,fmt::v10::detail::digit_grouping<char>>
                   (appender out,unsigned_long significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar1;
  appender out_00;
  format_decimal_result<char_*> fVar2;
  char buffer_1 [20];
  char buffer [20];
  char local_258 [32];
  undefined **local_238;
  undefined1 *puStack_230;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    local_238 = (undefined **)0x0;
    puStack_230 = (undefined1 *)0x0;
    uStack_228 = 0;
    fVar2 = format_decimal<char,unsigned_long>((char *)&local_238,significand,significand_size);
    out_00 = copy_str_noinline<char,char*,fmt::v10::appender>((char *)&local_238,fVar2.end,out);
    local_238 = (undefined **)CONCAT71(local_238._1_7_,0x30);
    bVar1.container =
         (buffer<char> *)fill_n<fmt::v10::appender,int,char>(out_00,exponent,(char *)&local_238);
  }
  else {
    uStack_228 = 0;
    uStack_224 = 0;
    local_238 = &PTR_grow_0013b950;
    local_220 = 500;
    local_258[0] = '\0';
    local_258[1] = '\0';
    local_258[2] = '\0';
    local_258[3] = '\0';
    local_258[4] = '\0';
    local_258[5] = '\0';
    local_258[6] = '\0';
    local_258[7] = '\0';
    local_258[8] = '\0';
    local_258[9] = '\0';
    local_258[10] = '\0';
    local_258[0xb] = '\0';
    local_258[0xc] = '\0';
    local_258[0xd] = '\0';
    local_258[0xe] = '\0';
    local_258[0xf] = '\0';
    local_258[0x10] = '\0';
    local_258[0x11] = '\0';
    local_258[0x12] = '\0';
    local_258[0x13] = '\0';
    puStack_230 = local_218;
    fVar2 = format_decimal<char,unsigned_long>(local_258,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v10::appender>(local_258,fVar2.end,(appender)&local_238);
    local_258[0] = 0x30;
    fill_n<fmt::v10::appender,int,char>((appender)&local_238,exponent,local_258);
    digits.size_._0_4_ = uStack_228;
    digits.data_ = puStack_230;
    digits.size_._4_4_ = uStack_224;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    if (puStack_230 != local_218) {
      operator_delete(puStack_230);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}